

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCOpenings.cpp
# Opt level: O1

void Assimp::IFC::QuadrifyPart
               (IfcVector2 *pmin,IfcVector2 *pmax,XYSortedField *field,
               vector<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
               *bbs,vector<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_> *out)

{
  _Rb_tree_header *p_Var1;
  pointer *ppaVar2;
  double dVar3;
  double dVar4;
  pointer ppVar5;
  _Base_ptr p_Var6;
  iterator iVar7;
  bool bVar8;
  XYSortedField *field_00;
  _Rb_tree_node_base *in_RAX;
  double *pdVar9;
  _Base_ptr p_Var10;
  uint uVar11;
  double *pdVar12;
  bool bVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  aiVector2t<double> local_98;
  double local_88;
  double local_80;
  double *local_78;
  double *local_70;
  double local_68;
  uint local_5c;
  double local_58;
  XYSortedField *local_50;
  IfcVector2 *local_48;
  IfcVector2 local_40;
  
  local_58 = pmin->x;
  local_68 = pmax->x;
  if ((local_58 - local_68 != 0.0) || (NAN(local_58 - local_68))) {
    local_78 = (double *)pmin->y;
    local_70 = (double *)pmax->y;
    if (((double)local_78 - (double)local_70 != 0.0) || (NAN((double)local_78 - (double)local_70)))
    {
      p_Var10 = (field->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(field->_M_t)._M_impl.super__Rb_tree_header;
      local_50 = field;
      if ((_Rb_tree_header *)p_Var10 == p_Var1) {
        uVar14 = 0x20000000;
        uVar15 = 0x4202a05f;
        uVar11 = 0;
        local_88 = 10000000000.0;
      }
      else {
        ppVar5 = (bbs->
                 super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        local_5c = 0;
        local_88 = 10000000000.0;
        local_80 = 10000000000.0;
        local_48 = pmax;
        do {
          p_Var6 = p_Var10[1]._M_left;
          dVar3 = ppVar5[(long)p_Var6].first.x;
          if (local_68 <= dVar3) {
            bVar13 = false;
          }
          else {
            dVar4 = ppVar5[(long)p_Var6].second.x;
            bVar13 = true;
            if (((local_58 < dVar4) && ((double)local_78 < ppVar5[(long)p_Var6].second.y)) &&
               (pdVar9 = &ppVar5[(long)p_Var6].first.y,
               *pdVar9 <= (double)local_70 && (double)local_70 != *pdVar9)) {
              local_5c = (uint)CONCAT71((int7)((ulong)in_RAX >> 8),1);
              bVar13 = false;
              local_88 = dVar3;
              local_80 = dVar4;
            }
          }
          in_RAX = p_Var10;
        } while ((bVar13) &&
                (in_RAX = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10), p_Var10 = in_RAX,
                (_Rb_tree_header *)in_RAX != p_Var1));
        uVar14 = SUB84(local_80,0);
        uVar15 = (undefined4)((ulong)local_80 >> 0x20);
        p_Var10 = in_RAX;
        pmax = local_48;
        uVar11 = local_5c;
      }
      local_70 = &pmin->y;
      local_78 = &pmax->y;
      if ((uVar11 & 1) == 0) {
        iVar7._M_current =
             (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>const&>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar7,pmin
                    );
        }
        else {
          dVar3 = pmin->y;
          (iVar7._M_current)->x = pmin->x;
          (iVar7._M_current)->y = dVar3;
          ppaVar2 = &(out->
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar2 = *ppaVar2 + 1;
        }
        local_98.x = pmin->x;
        local_98.y = *local_78;
        iVar7._M_current =
             (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar7,
                     &local_98);
        }
        else {
          (iVar7._M_current)->x = local_98.x;
          (iVar7._M_current)->y = local_98.y;
          ppaVar2 = &(out->
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar2 = *ppaVar2 + 1;
        }
        iVar7._M_current =
             (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>const&>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar7,pmax
                    );
        }
        else {
          dVar3 = pmax->y;
          (iVar7._M_current)->x = pmax->x;
          (iVar7._M_current)->y = dVar3;
          ppaVar2 = &(out->
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar2 = *ppaVar2 + 1;
        }
        local_98.x = pmax->x;
        local_98.y = *local_70;
      }
      else {
        local_80 = (double)CONCAT44(uVar15,uVar14);
        uVar14 = SUB84(local_88,0);
        uVar15 = (undefined4)((ulong)local_88 >> 0x20);
        if (local_88 <= local_58) {
          uVar14 = SUB84(local_58,0);
          uVar15 = (undefined4)((ulong)local_58 >> 0x20);
        }
        local_88 = (double)CONCAT44(uVar15,uVar14);
        dVar3 = (double)CONCAT44(uVar15,uVar14) - local_58;
        if ((dVar3 != 0.0) || (NAN(dVar3))) {
          iVar7._M_current =
               (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
            _M_realloc_insert<aiVector2t<double>const&>
                      ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar7,
                       pmin);
          }
          else {
            dVar3 = pmin->y;
            (iVar7._M_current)->x = pmin->x;
            (iVar7._M_current)->y = dVar3;
            ppaVar2 = &(out->
                       super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppaVar2 = *ppaVar2 + 1;
          }
          local_98.x = pmin->x;
          local_98.y = *local_78;
          iVar7._M_current =
               (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
            _M_realloc_insert<aiVector2t<double>>
                      ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar7,
                       &local_98);
          }
          else {
            (iVar7._M_current)->x = local_98.x;
            (iVar7._M_current)->y = local_98.y;
            ppaVar2 = &(out->
                       super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppaVar2 = *ppaVar2 + 1;
          }
          local_98.y = *local_78;
          local_98.x = local_88;
          iVar7._M_current =
               (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
            _M_realloc_insert<aiVector2t<double>>
                      ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar7,
                       &local_98);
          }
          else {
            (iVar7._M_current)->x = local_88;
            (iVar7._M_current)->y = local_98.y;
            ppaVar2 = &(out->
                       super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppaVar2 = *ppaVar2 + 1;
          }
          local_98.y = *local_70;
          local_98.x = local_88;
          iVar7._M_current =
               (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar7._M_current ==
              (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
            _M_realloc_insert<aiVector2t<double>>
                      ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar7,
                       &local_98);
          }
          else {
            (iVar7._M_current)->x = local_88;
            (iVar7._M_current)->y = local_98.y;
            ppaVar2 = &(out->
                       super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>)
                       ._M_impl.super__Vector_impl_data._M_finish;
            *ppaVar2 = *ppaVar2 + 1;
          }
        }
        uVar14 = SUB84(local_80,0);
        uVar15 = (undefined4)((ulong)local_80 >> 0x20);
        if (local_68 <= local_80) {
          uVar14 = SUB84(local_68,0);
          uVar15 = (undefined4)((ulong)local_68 >> 0x20);
        }
        local_80 = (double)CONCAT44(uVar15,uVar14);
        dVar3 = *local_70;
        uVar14 = SUB84(dVar3,0);
        uVar15 = (undefined4)((ulong)dVar3 >> 0x20);
        if ((_Rb_tree_header *)p_Var10 == p_Var1) {
          bVar13 = false;
        }
        else {
          bVar13 = false;
          local_68 = dVar3;
          do {
            p_Var6 = p_Var10[1]._M_left;
            ppVar5 = (bbs->
                     super__Vector_base<std::pair<aiVector2t<double>,_aiVector2t<double>_>,_std::allocator<std::pair<aiVector2t<double>,_aiVector2t<double>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start;
            if (local_88 < ppVar5[(long)p_Var6].first.x) {
LAB_005da3e6:
              bVar8 = false;
            }
            else {
              dVar3 = ppVar5[(long)p_Var6].first.y;
              if (*local_78 <= dVar3) goto LAB_005da3e6;
              dVar4 = ppVar5[(long)p_Var6].second.y;
              bVar8 = true;
              if (local_68 < dVar4) {
                pdVar9 = &ppVar5[(long)p_Var6].first.y;
                if (dVar3 < *local_70) {
                  pdVar9 = local_70;
                }
                pdVar12 = &ppVar5[(long)p_Var6].second.y;
                if (*local_78 < dVar4) {
                  pdVar12 = local_78;
                }
                dVar3 = *pdVar12;
                if (local_68 < *pdVar9) {
                  local_98.x = local_88;
                  local_98.y = local_68;
                  local_40.x = local_80;
                  local_58 = *pdVar12;
                  local_40.y = *pdVar9;
                  QuadrifyPart(&local_98,&local_40,local_50,bbs,out);
                  local_68 = local_58;
                  dVar3 = local_68;
                }
                local_68 = dVar3;
                bVar8 = true;
                bVar13 = true;
              }
            }
          } while ((bVar8) &&
                  (p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10),
                  (_Rb_tree_header *)p_Var10 != p_Var1));
          uVar14 = SUB84(local_68,0);
          uVar15 = (undefined4)((ulong)local_68 >> 0x20);
        }
        field_00 = local_50;
        if (bVar13) {
          local_98.y = (double)CONCAT44(uVar15,uVar14);
          if (local_98.y < *local_78) {
            local_98.x = local_88;
            local_40.x = local_80;
            local_40.y = *local_78;
            QuadrifyPart(&local_98,&local_40,local_50,bbs,out);
          }
          dVar3 = pmax->x - local_80;
          if ((dVar3 == 0.0) && (!NAN(dVar3))) {
            return;
          }
          local_98.y = *local_70;
          local_98.x = local_80;
          QuadrifyPart(&local_98,pmax,field_00,bbs,out);
          return;
        }
        local_98.y = *local_70;
        local_98.x = local_88;
        iVar7._M_current =
             (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar7,
                     &local_98);
        }
        else {
          (iVar7._M_current)->x = local_88;
          (iVar7._M_current)->y = local_98.y;
          ppaVar2 = &(out->
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar2 = *ppaVar2 + 1;
        }
        local_98.y = *local_78;
        local_98.x = local_88;
        iVar7._M_current =
             (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar7,
                     &local_98);
        }
        else {
          (iVar7._M_current)->x = local_88;
          (iVar7._M_current)->y = local_98.y;
          ppaVar2 = &(out->
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar2 = *ppaVar2 + 1;
        }
        local_98.y = *local_78;
        local_98.x = local_80;
        iVar7._M_current =
             (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
          _M_realloc_insert<aiVector2t<double>>
                    ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar7,
                     &local_98);
        }
        else {
          (iVar7._M_current)->x = local_80;
          (iVar7._M_current)->y = local_98.y;
          ppaVar2 = &(out->
                     super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish;
          *ppaVar2 = *ppaVar2 + 1;
        }
        local_98.y = *local_70;
        local_98.x = local_80;
      }
      iVar7._M_current =
           (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar7._M_current ==
          (out->super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<aiVector2t<double>,std::allocator<aiVector2t<double>>>::
        _M_realloc_insert<aiVector2t<double>>
                  ((vector<aiVector2t<double>,std::allocator<aiVector2t<double>>> *)out,iVar7,
                   &local_98);
      }
      else {
        (iVar7._M_current)->x = local_98.x;
        (iVar7._M_current)->y = local_98.y;
        ppaVar2 = &(out->
                   super__Vector_base<aiVector2t<double>,_std::allocator<aiVector2t<double>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppaVar2 = *ppaVar2 + 1;
      }
    }
  }
  return;
}

Assistant:

void QuadrifyPart(const IfcVector2& pmin, const IfcVector2& pmax, XYSortedField& field,
    const std::vector< BoundingBox >& bbs,
    std::vector<IfcVector2>& out)
{
    if (!(pmin.x-pmax.x) || !(pmin.y-pmax.y)) {
        return;
    }

    IfcFloat xs = 1e10, xe = 1e10;
    bool found = false;

    // Search along the x-axis until we find an opening
    XYSortedField::iterator start = field.begin();
    for(; start != field.end(); ++start) {
        const BoundingBox& bb = bbs[(*start).second];
        if(bb.first.x >= pmax.x) {
            break;
        }

        if (bb.second.x > pmin.x && bb.second.y > pmin.y && bb.first.y < pmax.y) {
            xs = bb.first.x;
            xe = bb.second.x;
            found = true;
            break;
        }
    }

    if (!found) {
        // the rectangle [pmin,pend] is opaque, fill it
        out.push_back(pmin);
        out.push_back(IfcVector2(pmin.x,pmax.y));
        out.push_back(pmax);
        out.push_back(IfcVector2(pmax.x,pmin.y));
        return;
    }

    xs = std::max(pmin.x,xs);
    xe = std::min(pmax.x,xe);

    // see if there's an offset to fill at the top of our quad
    if (xs - pmin.x) {
        out.push_back(pmin);
        out.push_back(IfcVector2(pmin.x,pmax.y));
        out.push_back(IfcVector2(xs,pmax.y));
        out.push_back(IfcVector2(xs,pmin.y));
    }

    // search along the y-axis for all openings that overlap xs and our quad
    IfcFloat ylast = pmin.y;
    found = false;
    for(; start != field.end(); ++start) {
        const BoundingBox& bb = bbs[(*start).second];
        if (bb.first.x > xs || bb.first.y >= pmax.y) {
            break;
        }

        if (bb.second.y > ylast) {

            found = true;
            const IfcFloat ys = std::max(bb.first.y,pmin.y), ye = std::min(bb.second.y,pmax.y);
            if (ys - ylast > 0.0f) {
                QuadrifyPart( IfcVector2(xs,ylast), IfcVector2(xe,ys) ,field,bbs,out);
            }

            // the following are the window vertices

            /*wnd.push_back(IfcVector2(xs,ys));
            wnd.push_back(IfcVector2(xs,ye));
            wnd.push_back(IfcVector2(xe,ye));
            wnd.push_back(IfcVector2(xe,ys));*/
            ylast = ye;
        }
    }
    if (!found) {
        // the rectangle [pmin,pend] is opaque, fill it
        out.push_back(IfcVector2(xs,pmin.y));
        out.push_back(IfcVector2(xs,pmax.y));
        out.push_back(IfcVector2(xe,pmax.y));
        out.push_back(IfcVector2(xe,pmin.y));
        return;
    }
    if (ylast < pmax.y) {
        QuadrifyPart( IfcVector2(xs,ylast), IfcVector2(xe,pmax.y) ,field,bbs,out);
    }

    // now for the whole rest
    if (pmax.x-xe) {
        QuadrifyPart(IfcVector2(xe,pmin.y), pmax ,field,bbs,out);
    }
}